

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_type.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_2::ValidateTypeUntypedPointerKHR(ValidationState_t *_,Instruction *inst)

{
  bool bVar1;
  spv_const_context psVar2;
  DiagnosticStream *pDVar3;
  DiagnosticStream local_3d8;
  DiagnosticStream local_200;
  StorageClass local_24;
  Instruction *pIStack_20;
  StorageClass sc;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_20 = inst;
  inst_local = (Instruction *)_;
  psVar2 = ValidationState_t::context(_);
  bVar1 = spvIsVulkanEnv(psVar2->target_env);
  if ((bVar1) &&
     (local_24 = val::Instruction::GetOperandAs<spv::StorageClass>(pIStack_20,1),
     local_24 != StorageClassUniform)) {
    if (local_24 == StorageClassWorkgroup) {
      bVar1 = ValidationState_t::HasCapability
                        ((ValidationState_t *)inst_local,CapabilityWorkgroupMemoryExplicitLayoutKHR)
      ;
      if (!bVar1) {
        ValidationState_t::diag
                  (&local_200,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
        pDVar3 = DiagnosticStream::operator<<
                           (&local_200,
                            (char (*) [104])
                            "Workgroup storage class untyped pointers in Vulkan require WorkgroupMemoryExplicitLayoutKHR be declared"
                           );
        __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
        DiagnosticStream::~DiagnosticStream(&local_200);
        return __local._4_4_;
      }
    }
    else if (((local_24 != PushConstant) && (local_24 != StorageBuffer)) &&
            (local_24 != PhysicalStorageBuffer)) {
      ValidationState_t::diag
                (&local_3d8,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_ID,pIStack_20);
      pDVar3 = DiagnosticStream::operator<<
                         (&local_3d8,
                          (char (*) [85])
                          "In Vulkan, untyped pointers can only be used in an explicitly laid out storage class"
                         );
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      DiagnosticStream::~DiagnosticStream(&local_3d8);
      return __local._4_4_;
    }
  }
  return SPV_SUCCESS;
}

Assistant:

spv_result_t ValidateTypeUntypedPointerKHR(ValidationState_t& _,
                                           const Instruction* inst) {
  if (spvIsVulkanEnv(_.context()->target_env)) {
    const auto sc = inst->GetOperandAs<spv::StorageClass>(1);
    switch (sc) {
      case spv::StorageClass::Workgroup:
        if (!_.HasCapability(
                spv::Capability::WorkgroupMemoryExplicitLayoutKHR)) {
          return _.diag(SPV_ERROR_INVALID_ID, inst)
                 << "Workgroup storage class untyped pointers in Vulkan "
                    "require WorkgroupMemoryExplicitLayoutKHR be declared";
        }
        break;
      case spv::StorageClass::StorageBuffer:
      case spv::StorageClass::PhysicalStorageBuffer:
      case spv::StorageClass::Uniform:
      case spv::StorageClass::PushConstant:
        break;
      default:
        return _.diag(SPV_ERROR_INVALID_ID, inst)
               << "In Vulkan, untyped pointers can only be used in an "
                  "explicitly laid out storage class";
    }
  }
  return SPV_SUCCESS;
}